

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::BitsToRealFunction::eval
          (BitsToRealFunction *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  real_t real;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  ConstantValue *in_RDI;
  double v;
  optional<unsigned_long> oVar2;
  uint64_t i;
  ConstantValue val;
  ConstantValue *in_stack_ffffffffffffff28;
  EvalContext *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  ConstantValue *this_00;
  real_t local_90;
  undefined4 local_84;
  _Storage<unsigned_long,_true> local_80;
  undefined1 local_78;
  double local_70;
  undefined4 local_68;
  
  this_00 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval((Expression *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                   in_stack_ffffffffffffff30);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x8d0704);
  if (bVar1) {
    slang::ConstantValue::integer((ConstantValue *)0x8d075e);
    oVar2 = SVInt::as<unsigned_long>((SVInt *)this_00);
    local_80._M_value =
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_78 = oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    local_84 = 0;
    real.v = (double)std::optional<unsigned_long>::value_or<int>
                               ((optional<unsigned_long> *)
                                CONCAT17(local_78,in_stack_ffffffffffffff38),
                                (int *)in_stack_ffffffffffffff30);
    local_70 = real.v;
    v = std::bit_cast<double,_unsigned_long>((unsigned_long *)&local_70);
    real_t::real_t(&local_90,v);
    slang::ConstantValue::ConstantValue(in_stack_ffffffffffffff28,real);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  local_68 = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x8d07f1);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto val = args[0]->eval(context);
        if (!val)
            return nullptr;

        uint64_t i = val.integer().as<uint64_t>().value_or(0);
        return real_t(std::bit_cast<double>(i));
    }